

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_tracked_vector::test_method(test_tracked_vector *this)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe3a8;
  lazy_ostream *in_stack_ffffffffffffe3b0;
  assertion_result *in_stack_ffffffffffffe3b8;
  lazy_ostream *in_stack_ffffffffffffe3d0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *in_stack_ffffffffffffe3d8;
  size_t line_num;
  undefined7 in_stack_ffffffffffffe3e0;
  undefined1 in_stack_ffffffffffffe3e7;
  lazy_ostream *in_stack_ffffffffffffe3e8;
  Tracker *in_stack_ffffffffffffe3f0;
  undefined7 in_stack_ffffffffffffe3f8;
  undefined1 in_stack_ffffffffffffe3ff;
  Tracker *in_stack_ffffffffffffe400;
  test_tracked_vector *this_local;
  lazy_ostream local_16cc;
  undefined1 local_16b8 [68];
  lazy_ostream local_1674;
  undefined1 local_1660 [68];
  lazy_ostream local_161c;
  undefined1 local_1608 [64];
  const_string local_15c8 [2];
  lazy_ostream local_15a8 [2];
  assertion_result local_1588 [2];
  const_string local_1550 [2];
  lazy_ostream local_1530 [2];
  assertion_result local_1510 [2];
  const_string local_14d8 [2];
  lazy_ostream local_14b8 [2];
  assertion_result local_1498 [2];
  lazy_ostream local_145c;
  undefined1 local_1440 [88];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v8;
  lazy_ostream local_13cc;
  undefined1 local_13b8 [68];
  lazy_ostream local_1374;
  undefined1 local_1360 [68];
  lazy_ostream local_131c;
  undefined1 local_1308 [68];
  lazy_ostream local_12c4;
  undefined1 local_12b0 [64];
  const_string local_1270 [2];
  lazy_ostream local_1250 [2];
  assertion_result local_1230 [2];
  const_string local_11f8 [2];
  lazy_ostream local_11d8 [2];
  assertion_result local_11b8 [2];
  const_string local_1180 [2];
  lazy_ostream local_1160 [2];
  assertion_result local_1140 [2];
  const_string local_1108 [2];
  lazy_ostream local_10e8 [2];
  assertion_result local_10c8 [2];
  lazy_ostream local_108c;
  undefined1 local_1070 [88];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v7;
  undefined1 local_1000 [8];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [68];
  lazy_ostream local_fa4;
  undefined1 local_f90 [68];
  lazy_ostream local_f4c;
  undefined1 local_f38 [64];
  const_string local_ef8 [2];
  lazy_ostream local_ed8 [2];
  assertion_result local_eb8 [2];
  const_string local_e80 [2];
  lazy_ostream local_e60 [2];
  assertion_result local_e40 [2];
  const_string local_e08 [2];
  lazy_ostream local_de8 [2];
  assertion_result local_dc8 [2];
  lazy_ostream local_d8c;
  undefined1 local_d70 [88];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v6;
  lazy_ostream local_cfc;
  undefined1 local_ce8 [68];
  lazy_ostream local_ca4;
  undefined1 local_c90 [68];
  lazy_ostream local_c4c;
  undefined1 local_c38 [68];
  lazy_ostream local_bf4;
  undefined1 local_be0 [64];
  const_string local_ba0 [2];
  lazy_ostream local_b80 [2];
  assertion_result local_b60 [2];
  const_string local_b28 [2];
  lazy_ostream local_b08 [2];
  assertion_result local_ae8 [2];
  const_string local_ab0 [2];
  lazy_ostream local_a90 [2];
  assertion_result local_a70 [2];
  const_string local_a38 [2];
  lazy_ostream local_a18 [2];
  assertion_result local_9f8 [2];
  lazy_ostream local_9bc;
  undefined1 local_9a0 [88];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v5;
  lazy_ostream local_92c;
  undefined1 local_918 [68];
  lazy_ostream local_8d4;
  undefined1 local_8c0 [68];
  lazy_ostream local_87c;
  undefined1 local_868 [64];
  const_string local_828 [2];
  lazy_ostream local_808 [2];
  assertion_result local_7e8 [2];
  const_string local_7b0 [2];
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  const_string local_738 [2];
  lazy_ostream local_718 [2];
  assertion_result local_6f8 [2];
  lazy_ostream local_6bc;
  undefined1 local_6a0 [64];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v4;
  lazy_ostream local_644;
  undefined1 local_630 [68];
  lazy_ostream local_5ec;
  undefined1 local_5d8 [64];
  const_string local_598 [2];
  lazy_ostream local_578 [2];
  assertion_result local_558 [2];
  const_string local_520 [2];
  lazy_ostream local_500 [2];
  assertion_result local_4e0 [2];
  lazy_ostream local_4a4;
  undefined1 local_488 [64];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v3;
  lazy_ostream local_42c;
  undefined1 local_418 [64];
  const_string local_3d8 [2];
  lazy_ostream local_3b8 [2];
  assertion_result local_398 [2];
  lazy_ostream local_35c;
  undefined1 local_340 [64];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v2;
  lazy_ostream local_2e4;
  undefined1 local_2d0 [64];
  const_string local_290 [2];
  lazy_ostream local_270 [2];
  assertion_result local_250 [2];
  lazy_ostream local_214;
  undefined1 local_1f8 [64];
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v1;
  const_string local_1a0 [2];
  lazy_ostream local_180 [2];
  assertion_result local_160 [2];
  const_string local_128 [2];
  lazy_ostream local_108 [2];
  assertion_result local_e8 [2];
  const_string local_b0 [2];
  lazy_ostream local_90 [2];
  assertion_result local_70 [2];
  Tracker t3;
  Tracker t2;
  Tracker t1;
  
  local_1000 = (undefined1  [8])0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown_3::Tracker::Tracker((Tracker *)in_stack_ffffffffffffe3a8);
  anon_unknown_3::Tracker::Tracker((Tracker *)in_stack_ffffffffffffe3a8);
  anon_unknown_3::Tracker::Tracker((Tracker *)in_stack_ffffffffffffe3a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_70,local_90,local_b0,0x5f8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e8,local_108,local_128,0x5f9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_160,local_180,local_1a0,0x5fa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Vector<util_tests::(anonymous_namespace)::Tracker&>((Tracker *)in_stack_ffffffffffffe3e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_214._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_214._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bc11bb;
    in_stack_ffffffffffffe3b0 = &local_214;
    in_stack_ffffffffffffe3a8 = "v1.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1f8,&local_214.field_0xc,0x5fd,1,2,
               (undefined1 *)((long)&local_214._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_250,local_270,local_290,0x5fe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_2e4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_2e4;
    in_stack_ffffffffffffe3a8 = "v1[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_2d0,(undefined1 *)((long)&local_2e4._vptr_lazy_ostream + 4),0x5ff,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Vector<util_tests::(anonymous_namespace)::Tracker>((Tracker *)in_stack_ffffffffffffe3e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_35c._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_35c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bc11bb;
    in_stack_ffffffffffffe3b0 = &local_35c;
    in_stack_ffffffffffffe3a8 = "v2.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_340,&local_35c.field_0xc,0x602,1,2,
               (undefined1 *)((long)&local_35c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_398,local_3b8,local_3d8,0x603,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_42c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1d1f9c0;
    in_stack_ffffffffffffe3b0 = &local_42c;
    in_stack_ffffffffffffe3a8 = "v2[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_418,(undefined1 *)((long)&local_42c._vptr_lazy_ostream + 4),0x604,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Vector<util_tests::(anonymous_namespace)::Tracker&,util_tests::(anonymous_namespace)::Tracker>
            ((Tracker *)CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8),
             in_stack_ffffffffffffe3f0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_4a4._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_4a4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1c2381d;
    in_stack_ffffffffffffe3b0 = &local_4a4;
    in_stack_ffffffffffffe3a8 = "v3.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_488,&local_4a4.field_0xc,0x607,1,2,
               (undefined1 *)((long)&local_4a4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4e0,local_500,local_520,0x608,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_558,local_578,local_598,0x609,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_5ec._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_5ec;
    in_stack_ffffffffffffe3a8 = "v3[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_5d8,(undefined1 *)((long)&local_5ec._vptr_lazy_ostream + 4),0x60a,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_644._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1d1f9c0;
    in_stack_ffffffffffffe3b0 = &local_644;
    in_stack_ffffffffffffe3a8 = "v3[1].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_630,(undefined1 *)((long)&local_644._vptr_lazy_ostream + 4),0x60b,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
  Vector<util_tests::(anonymous_namespace)::Tracker,util_tests::(anonymous_namespace)::Tracker&,util_tests::(anonymous_namespace)::Tracker>
            (in_stack_ffffffffffffe400,
             (Tracker *)CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8),
             in_stack_ffffffffffffe3f0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_6bc._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_6bc._vptr_lazy_ostream._0_4_ = 3;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1c9d877;
    in_stack_ffffffffffffe3b0 = &local_6bc;
    in_stack_ffffffffffffe3a8 = "v4.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_6a0,&local_6bc.field_0xc,0x60e,1,2,
               (undefined1 *)((long)&local_6bc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6f8,local_718,local_738,0x60f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_790,local_7b0,0x610,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7e8,local_808,local_828,0x611,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_87c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_87c;
    in_stack_ffffffffffffe3a8 = "v4[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_868,(undefined1 *)((long)&local_87c._vptr_lazy_ostream + 4),0x612,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_8d4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_8d4;
    in_stack_ffffffffffffe3a8 = "v4[1].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_8c0,(undefined1 *)((long)&local_8d4._vptr_lazy_ostream + 4),0x613,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_92c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1d1f9c0;
    in_stack_ffffffffffffe3b0 = &local_92c;
    in_stack_ffffffffffffe3a8 = "v4[2].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_918,(undefined1 *)((long)&local_92c._vptr_lazy_ostream + 4),0x614,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)in_stack_ffffffffffffe400,
           (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8));
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
             in_stack_ffffffffffffe3d8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_9bc._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_9bc._vptr_lazy_ostream._0_4_ = 4;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bb85e8;
    in_stack_ffffffffffffe3b0 = &local_9bc;
    in_stack_ffffffffffffe3a8 = "v5.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_9a0,&local_9bc.field_0xc,0x617,1,2,
               (undefined1 *)((long)&local_9bc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9f8,local_a18,local_a38,0x618,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a70,local_a90,local_ab0,0x619,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ae8,local_b08,local_b28,0x61a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b60,local_b80,local_ba0,0x61b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_bf4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bc65e2;
    in_stack_ffffffffffffe3b0 = &local_bf4;
    in_stack_ffffffffffffe3a8 = "v5[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_be0,(undefined1 *)((long)&local_bf4._vptr_lazy_ostream + 4),0x61c,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_c4c._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bc65e2;
    in_stack_ffffffffffffe3b0 = &local_c4c;
    in_stack_ffffffffffffe3a8 = "v5[1].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_c38,(undefined1 *)((long)&local_c4c._vptr_lazy_ostream + 4),0x61d,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_ca4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bc65e2;
    in_stack_ffffffffffffe3b0 = &local_ca4;
    in_stack_ffffffffffffe3a8 = "v5[2].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_c90,(undefined1 *)((long)&local_ca4._vptr_lazy_ostream + 4),0x61e,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_cfc._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_cfc;
    in_stack_ffffffffffffe3a8 = "v5[3].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_ce8,(undefined1 *)((long)&local_cfc._vptr_lazy_ostream + 4),0x61f,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)in_stack_ffffffffffffe3a8,
           (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)0xc80953);
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
             in_stack_ffffffffffffe3d8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_d8c._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_d8c._vptr_lazy_ostream._0_4_ = 3;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1c9d877;
    in_stack_ffffffffffffe3b0 = &local_d8c;
    in_stack_ffffffffffffe3a8 = "v6.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_d70,&local_d8c.field_0xc,0x622,1,2,
               (undefined1 *)((long)&local_d8c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_dc8,local_de8,local_e08,0x623,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e40,local_e60,local_e80,0x624,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_eb8,local_ed8,local_ef8,0x625,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_f4c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_f4c;
    in_stack_ffffffffffffe3a8 = "v6[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_f38,(undefined1 *)((long)&local_f4c._vptr_lazy_ostream + 4),0x626,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_fa4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bc65e2;
    in_stack_ffffffffffffe3b0 = &local_fa4;
    in_stack_ffffffffffffe3a8 = "v6[1].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_f90,(undefined1 *)((long)&local_fa4._vptr_lazy_ostream + 4),0x627,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_1000._4_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = (lazy_ostream *)(local_1000 + 4);
    in_stack_ffffffffffffe3a8 = "v6[2].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_fe8,local_ff8,0x628,1,2,&pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)in_stack_ffffffffffffe400,
           (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)CONCAT17(in_stack_ffffffffffffe3ff,in_stack_ffffffffffffe3f8));
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
             in_stack_ffffffffffffe3d8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_108c._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_108c._vptr_lazy_ostream._0_4_ = 4;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1bb85e8;
    in_stack_ffffffffffffe3b0 = &local_108c;
    in_stack_ffffffffffffe3a8 = "v7.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1070,&local_108c.field_0xc,0x62b,1,2,
               (undefined1 *)((long)&local_108c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10c8,local_10e8,local_1108,0x62c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1140,local_1160,local_1180,0x62d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11b8,local_11d8,local_11f8,0x62e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1230,local_1250,local_1270,0x62f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_12c4._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_12c4;
    in_stack_ffffffffffffe3a8 = "v7[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_12b0,(undefined1 *)((long)&local_12c4._vptr_lazy_ostream + 4),0x630,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_131c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_131c;
    in_stack_ffffffffffffe3a8 = "v7[1].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1308,(undefined1 *)((long)&local_131c._vptr_lazy_ostream + 4),0x631,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_1374._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_1374;
    in_stack_ffffffffffffe3a8 = "v7[2].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1360,(undefined1 *)((long)&local_1374._vptr_lazy_ostream + 4),0x632,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_13cc._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1d1f9c0;
    in_stack_ffffffffffffe3b0 = &local_13cc;
    in_stack_ffffffffffffe3a8 = "v7[3].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_13b8,(undefined1 *)((long)&local_13cc._vptr_lazy_ostream + 4),0x633,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)in_stack_ffffffffffffe3a8,
           (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)0xc81f1e);
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
             in_stack_ffffffffffffe3d8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    local_145c._4_8_ =
         std::
         vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         ::size((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 *)in_stack_ffffffffffffe3a8);
    local_145c._vptr_lazy_ostream._0_4_ = 3;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1c9d877;
    in_stack_ffffffffffffe3b0 = &local_145c;
    in_stack_ffffffffffffe3a8 = "v8.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1440,&local_145c.field_0xc,0x636,1,2,
               (undefined1 *)((long)&local_145c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1498,local_14b8,local_14d8,0x637,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1510,local_1530,local_1550,0x638,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    std::
    vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffe3b8,SUB81((ulong)in_stack_ffffffffffffe3b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffe3b0,(basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1588,local_15a8,local_15c8,0x639,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe3a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_161c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1d1f9c0;
    in_stack_ffffffffffffe3b0 = &local_161c;
    in_stack_ffffffffffffe3a8 = "v8[0].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1608,(undefined1 *)((long)&local_161c._vptr_lazy_ostream + 4),0x63a,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               (size_t)in_stack_ffffffffffffe3d8,(const_string *)in_stack_ffffffffffffe3d0);
    in_stack_ffffffffffffe3e8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_1674._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1ccb7e1;
    in_stack_ffffffffffffe3b0 = &local_1674;
    in_stack_ffffffffffffe3a8 = "v8[1].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1660,(undefined1 *)((long)&local_1674._vptr_lazy_ostream + 4),0x63b,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    in_stack_ffffffffffffe3e7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe3e7);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe3e8,
               (const_string *)CONCAT17(in_stack_ffffffffffffe3e7,in_stack_ffffffffffffe3e0),
               line_num,(const_string *)in_stack_ffffffffffffe3d0);
    in_stack_ffffffffffffe3d0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffe3b0,(char (*) [1])in_stack_ffffffffffffe3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe3b8,
               (pointer)in_stack_ffffffffffffe3b0,(unsigned_long)in_stack_ffffffffffffe3a8);
    pvVar3 = std::
             vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ::operator[]((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                           *)in_stack_ffffffffffffe3b8,(size_type)in_stack_ffffffffffffe3b0);
    local_16cc._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffe3b8 = (assertion_result *)0x1d1f9c0;
    in_stack_ffffffffffffe3b0 = &local_16cc;
    in_stack_ffffffffffffe3a8 = "v8[2].copies";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_16b8,(undefined1 *)((long)&local_16cc._vptr_lazy_ostream + 4),0x63c,1,2,
               &pvVar3->copies);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe3a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *)in_stack_ffffffffffffe3b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_tracked_vector)
{
    Tracker t1;
    Tracker t2;
    Tracker t3;

    BOOST_CHECK(t1.origin == &t1);
    BOOST_CHECK(t2.origin == &t2);
    BOOST_CHECK(t3.origin == &t3);

    auto v1 = Vector(t1);
    BOOST_CHECK_EQUAL(v1.size(), 1U);
    BOOST_CHECK(v1[0].origin == &t1);
    BOOST_CHECK_EQUAL(v1[0].copies, 1);

    auto v2 = Vector(std::move(t2));
    BOOST_CHECK_EQUAL(v2.size(), 1U);
    BOOST_CHECK(v2[0].origin == &t2); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v2[0].copies, 0);

    auto v3 = Vector(t1, std::move(t2));
    BOOST_CHECK_EQUAL(v3.size(), 2U);
    BOOST_CHECK(v3[0].origin == &t1);
    BOOST_CHECK(v3[1].origin == &t2); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v3[0].copies, 1);
    BOOST_CHECK_EQUAL(v3[1].copies, 0);

    auto v4 = Vector(std::move(v3[0]), v3[1], std::move(t3));
    BOOST_CHECK_EQUAL(v4.size(), 3U);
    BOOST_CHECK(v4[0].origin == &t1);
    BOOST_CHECK(v4[1].origin == &t2);
    BOOST_CHECK(v4[2].origin == &t3); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v4[0].copies, 1);
    BOOST_CHECK_EQUAL(v4[1].copies, 1);
    BOOST_CHECK_EQUAL(v4[2].copies, 0);

    auto v5 = Cat(v1, v4);
    BOOST_CHECK_EQUAL(v5.size(), 4U);
    BOOST_CHECK(v5[0].origin == &t1);
    BOOST_CHECK(v5[1].origin == &t1);
    BOOST_CHECK(v5[2].origin == &t2);
    BOOST_CHECK(v5[3].origin == &t3);
    BOOST_CHECK_EQUAL(v5[0].copies, 2);
    BOOST_CHECK_EQUAL(v5[1].copies, 2);
    BOOST_CHECK_EQUAL(v5[2].copies, 2);
    BOOST_CHECK_EQUAL(v5[3].copies, 1);

    auto v6 = Cat(std::move(v1), v3);
    BOOST_CHECK_EQUAL(v6.size(), 3U);
    BOOST_CHECK(v6[0].origin == &t1);
    BOOST_CHECK(v6[1].origin == &t1);
    BOOST_CHECK(v6[2].origin == &t2);
    BOOST_CHECK_EQUAL(v6[0].copies, 1);
    BOOST_CHECK_EQUAL(v6[1].copies, 2);
    BOOST_CHECK_EQUAL(v6[2].copies, 1);

    auto v7 = Cat(v2, std::move(v4));
    BOOST_CHECK_EQUAL(v7.size(), 4U);
    BOOST_CHECK(v7[0].origin == &t2);
    BOOST_CHECK(v7[1].origin == &t1);
    BOOST_CHECK(v7[2].origin == &t2);
    BOOST_CHECK(v7[3].origin == &t3);
    BOOST_CHECK_EQUAL(v7[0].copies, 1);
    BOOST_CHECK_EQUAL(v7[1].copies, 1);
    BOOST_CHECK_EQUAL(v7[2].copies, 1);
    BOOST_CHECK_EQUAL(v7[3].copies, 0);

    auto v8 = Cat(std::move(v2), std::move(v3));
    BOOST_CHECK_EQUAL(v8.size(), 3U);
    BOOST_CHECK(v8[0].origin == &t2);
    BOOST_CHECK(v8[1].origin == &t1);
    BOOST_CHECK(v8[2].origin == &t2);
    BOOST_CHECK_EQUAL(v8[0].copies, 0);
    BOOST_CHECK_EQUAL(v8[1].copies, 1);
    BOOST_CHECK_EQUAL(v8[2].copies, 0);
}